

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

char16 * Js::JavascriptLibrary::GetStringTemplateCallsiteObjectKey(Var callsite)

{
  uint uVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  BOOL BVar5;
  ES5Array *instance;
  JavascriptArray *this;
  JavascriptString *pJVar6;
  Recycler *this_00;
  undefined4 *puVar7;
  char16 *pcVar8;
  char16 *src;
  int iVar9;
  uint uVar10;
  char16 *dst;
  uint32 i;
  uint32 uVar11;
  uint uVar12;
  undefined1 local_88 [8];
  TrackAllocData data;
  Var local_38;
  Var var;
  ulong sizeInWords;
  
  instance = VarTo<Js::ES5Array>(callsite);
  scriptContext =
       (((((instance->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_38 = JavascriptOperators::OP_GetProperty(instance,0x12a,scriptContext);
  this = &VarTo<Js::ES5Array>(local_38)->super_JavascriptArray;
  uVar1 = (this->super_ArrayObject).length;
  if (uVar1 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x16c7,"(arrayLength != 0)","arrayLength != 0");
    if (!bVar3) goto LAB_00bee37d;
    *puVar7 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    uVar11 = 0;
    do {
      JavascriptArray::DirectGetItemAt<void*>(this,uVar11,&local_38);
      pJVar6 = VarTo<Js::JavascriptString>(local_38);
      cVar4 = JavascriptString::GetLength(pJVar6);
      iVar9 = iVar9 + cVar4;
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  iVar9 = iVar9 + uVar1 * 3;
  uVar10 = iVar9 - 3;
  uVar12 = iVar9 - 2;
  sizeInWords = (ulong)uVar12;
  local_88 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x16d2;
  data.plusSize = sizeInWords;
  this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_88);
  if (uVar10 == 0xffffffff) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    dst = (char16 *)&DAT_00000008;
  }
  else {
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00bee37d;
      *puVar7 = 0;
    }
    dst = (char16 *)
          Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                    (this_00,sizeInWords * 2);
    if (dst == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00bee37d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      dst = (char16 *)0x0;
    }
  }
  JavascriptArray::DirectGetItemAt<void*>(this,0,&local_38);
  pJVar6 = VarTo<Js::JavascriptString>(local_38);
  cVar4 = JavascriptString::GetLength(pJVar6);
  pcVar8 = JavascriptString::GetString(pJVar6);
  js_wmemcpy_s(dst,sizeInWords,pcVar8,(ulong)cVar4);
  if (1 < uVar1) {
    uVar12 = uVar12 - cVar4;
    pcVar8 = dst + cVar4;
    uVar11 = 1;
    do {
      js_wmemcpy_s(pcVar8,(ulong)uVar12,L"${}",3);
      data._32_8_ = pcVar8 + 3;
      JavascriptArray::DirectGetItemAt<void*>(this,uVar11,&local_38);
      pJVar6 = VarTo<Js::JavascriptString>(local_38);
      cVar4 = JavascriptString::GetLength(pJVar6);
      src = JavascriptString::GetString(pJVar6);
      js_wmemcpy_s((char16 *)data._32_8_,(ulong)(uVar12 - 3),src,(ulong)cVar4);
      pcVar8 = pcVar8 + (ulong)cVar4 + 3;
      uVar12 = (uVar12 - 3) - cVar4;
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  dst[uVar10] = L'\0';
  return dst;
}

Assistant:

const char16* JavascriptLibrary::GetStringTemplateCallsiteObjectKey(Var callsite)
    {
        // Calculate the key for the string template callsite object.
        // Key is combination of the raw string literals delimited by '${}' since string template literals cannot include that symbol.
        // `str1${expr1}str2${expr2}str3` => "str1${}str2${}str3"

        ES5Array* callsiteObj = VarTo<ES5Array>(callsite);
        ScriptContext* scriptContext = callsiteObj->GetScriptContext();

        Var var = JavascriptOperators::OP_GetProperty(callsiteObj, Js::PropertyIds::raw, scriptContext);
        ES5Array* rawArray = VarTo<ES5Array>(var);
        uint32 arrayLength = rawArray->GetLength();
        uint32 totalStringLength = 0;
        JavascriptString* str;

        Assert(arrayLength != 0);

        // Count the size in characters of the raw strings
        for (uint32 i = 0; i < arrayLength; i++)
        {
            rawArray->DirectGetItemAt(i, &var);
            str = VarTo<JavascriptString>(var);
            totalStringLength += str->GetLength();
        }

        uint32 keyLength = totalStringLength + (arrayLength - 1) * 3 + 1;
        char16* key = RecyclerNewArray(scriptContext->GetRecycler(), char16, keyLength);
        char16* ptr = key;
        charcount_t remainingSpace = keyLength;

        // Get first item before loop - there always must be at least one item
        rawArray->DirectGetItemAt(0, &var);
        str = VarTo<JavascriptString>(var);

        charcount_t len = str->GetLength();
        js_wmemcpy_s(ptr, remainingSpace, str->GetString(), len);
        ptr += len;
        remainingSpace -= len;

        // Append a delimiter and the rest of the items
        for (uint32 i = 1; i < arrayLength; i++)
        {
            len = 3; // strlen(_u("${}"));
            js_wmemcpy_s(ptr, remainingSpace, _u("${}"), len);
            ptr += len;
            remainingSpace -= len;

            rawArray->DirectGetItemAt(i, &var);
            str = VarTo<JavascriptString>(var);

            len = str->GetLength();
            js_wmemcpy_s(ptr, remainingSpace, str->GetString(), len);
            ptr += len;
            remainingSpace -= len;
        }

        // Ensure string is terminated
        key[keyLength - 1] = _u('\0');

        return key;
    }